

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGNode::dominates_all_reachable_exits
          (CFGNode *this,UnorderedSet<const_CFGNode_*> *completed,CFGNode *header)

{
  CFGNode *other;
  bool bVar1;
  size_type sVar2;
  reference ppCVar3;
  CFGNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  Vector<CFGNode_*> *__range2;
  CFGNode *local_38;
  CFGNode *local_30;
  CFGNode *local_28;
  CFGNode *header_local;
  UnorderedSet<const_CFGNode_*> *completed_local;
  CFGNode *this_local;
  
  local_30 = this;
  local_28 = header;
  header_local = (CFGNode *)completed;
  completed_local = (UnorderedSet<const_CFGNode_*> *)this;
  sVar2 = std::
          unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
          ::count(completed,&local_30);
  if (sVar2 == 0) {
    local_38 = this;
    std::
    unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
    ::insert((unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
              *)header_local,&local_38);
    if ((this->succ_back_edge != (CFGNode *)0x0) &&
       (bVar1 = dominates(local_28,this->succ_back_edge), !bVar1)) {
      return false;
    }
    __end2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(&this->succ);
    node = (CFGNode *)
           std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           end(&this->succ);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                       *)&node), bVar1) {
      ppCVar3 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end2);
      other = *ppCVar3;
      bVar1 = dominates(local_28,other);
      if ((!bVar1) ||
         (bVar1 = dominates_all_reachable_exits
                            (other,(UnorderedSet<const_CFGNode_*> *)header_local,local_28), !bVar1))
      {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end2);
    }
  }
  return true;
}

Assistant:

bool CFGNode::dominates_all_reachable_exits(UnorderedSet<const CFGNode *> &completed, const CFGNode &header) const
{
	if (!completed.count(this))
	{
		completed.insert(this);
		if (succ_back_edge && !header.dominates(succ_back_edge))
			return false;

		for (auto *node : succ)
			if (!header.dominates(node) || !node->dominates_all_reachable_exits(completed, header))
				return false;
	}

	return true;
}